

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_utilities.c
# Opt level: O1

char * trim(char *s)

{
  byte *pbVar1;
  ushort **ppuVar2;
  ushort *puVar3;
  byte bVar4;
  byte *pbVar5;
  
  bVar4 = *s;
  if (bVar4 != 0) {
    ppuVar2 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar2 + (ulong)bVar4 * 2 + 1) & 0x20) == 0) break;
      bVar4 = s[1];
      s = s + 1;
    } while (bVar4 != 0);
  }
  pbVar5 = (byte *)(s + -2);
  do {
    pbVar1 = pbVar5 + 2;
    pbVar5 = pbVar5 + 1;
  } while (*pbVar1 != 0);
  ppuVar2 = __ctype_b_loc();
  bVar4 = *pbVar5;
  puVar3 = *ppuVar2;
  while ((*(byte *)((long)puVar3 + (ulong)bVar4 * 2 + 1) & 0x20) != 0) {
    *pbVar5 = 0;
    bVar4 = pbVar5[-1];
    pbVar5 = pbVar5 + -1;
    puVar3 = *ppuVar2;
  }
  return s;
}

Assistant:

char * trim( char * s )
{
    char * p;

    /* Skip over leading whitespace */
    while ( *s && isspace( (unsigned char)*s ) )
    {
        ++s;
    }

    /* Trim trailing whitespace */
    p = s;

    while ( *p )
    {
        ++p;
    }

    while ( isspace( (unsigned char)*( --p ) ) )
    {
        *p = '\0';
    }

    return s;
}